

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O1

StringRef __thiscall llbuild::buildsystem::BuildKey::getCustomTaskData(BuildKey *this)

{
  uint uVar1;
  pointer pcVar2;
  Kind KVar3;
  StringRef SVar4;
  
  KVar3 = kindForIdentifier(*(this->key).key._M_dataplus._M_p);
  if (KVar3 == CustomTask) {
    pcVar2 = (this->key).key._M_dataplus._M_p;
    uVar1 = *(uint *)(pcVar2 + 1);
    SVar4.Length._0_4_ = ((int)(this->key).key._M_string_length - uVar1) + -5;
    SVar4.Data = pcVar2 + (ulong)uVar1 + 5;
    SVar4.Length._4_4_ = 0;
    return SVar4;
  }
  __assert_fail("isCustomTask()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0xed,"StringRef llbuild::buildsystem::BuildKey::getCustomTaskData() const");
}

Assistant:

StringRef getCustomTaskData() const {
    assert(isCustomTask());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    uint32_t dataSize = key.size() - 1 - sizeof(uint32_t) - nameSize;
    return StringRef(&key.data()[1 + sizeof(uint32_t) + nameSize], dataSize);
  }